

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::encryption_handler::switch_send_crypto
          (encryption_handler *this,shared_ptr<libtorrent::crypto_plugin> *crypto,
          int pending_encryption)

{
  int iVar1;
  bool bVar2;
  pointer pbVar3;
  reference pvVar4;
  shared_ptr<libtorrent::crypto_plugin> local_60;
  barrier local_50;
  _Self local_38;
  iterator b;
  _Self local_28;
  _List_iterator<libtorrent::aux::encryption_handler::barrier> end;
  bool place_barrier;
  int pending_encryption_local;
  shared_ptr<libtorrent::crypto_plugin> *crypto_local;
  encryption_handler *this_local;
  
  end._M_node._3_1_ = 0;
  end._M_node._4_4_ = pending_encryption;
  bVar2 = ::std::__cxx11::
          list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
          ::empty(&this->m_send_barriers);
  if (bVar2) {
    bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)crypto);
    if (bVar2) {
      end._M_node._3_1_ = 1;
    }
  }
  else {
    b = ::std::__cxx11::
        list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
        ::end(&this->m_send_barriers);
    local_28._M_node =
         (_List_node_base *)
         ::std::prev<std::_List_iterator<libtorrent::aux::encryption_handler::barrier>>(b._M_node,1)
    ;
    local_38._M_node =
         (_List_node_base *)
         ::std::__cxx11::
         list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
         ::begin(&this->m_send_barriers);
    while (bVar2 = ::std::operator!=(&local_38,&local_28), iVar1 = end._M_node._4_4_, bVar2) {
      pbVar3 = ::std::_List_iterator<libtorrent::aux::encryption_handler::barrier>::operator->
                         (&local_38);
      end._M_node._4_4_ = end._M_node._4_4_ - pbVar3->next;
      ::std::_List_iterator<libtorrent::aux::encryption_handler::barrier>::operator++(&local_38);
    }
    pvVar4 = ::std::__cxx11::
             list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
             ::back(&this->m_send_barriers);
    pvVar4->next = iVar1;
  }
  bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)crypto);
  if (bVar2) {
    ::std::shared_ptr<libtorrent::crypto_plugin>::shared_ptr(&local_60,crypto);
    barrier::barrier(&local_50,&local_60,0x7fffffff);
    ::std::__cxx11::
    list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
    ::push_back(&this->m_send_barriers,&local_50);
    barrier::~barrier(&local_50);
    ::std::shared_ptr<libtorrent::crypto_plugin>::~shared_ptr(&local_60);
  }
  return (bool)(end._M_node._3_1_ & 1);
}

Assistant:

bool encryption_handler::switch_send_crypto(std::shared_ptr<crypto_plugin> crypto
		, int pending_encryption)
	{
		bool place_barrier = false;
		if (!m_send_barriers.empty())
		{
			auto const end = std::prev(m_send_barriers.end());
			for (auto b = m_send_barriers.begin(); b != end; ++b)
				pending_encryption -= b->next;
			TORRENT_ASSERT(pending_encryption >= 0);
			m_send_barriers.back().next = pending_encryption;
		}
		else if (crypto)
			place_barrier = true;

		if (crypto)
			m_send_barriers.push_back(barrier(crypto, INT_MAX));

		return place_barrier;
	}